

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.hpp
# Opt level: O3

uint * __thiscall
sisl::sparse_array_n<unsigned_int,_3,_std::allocator<unsigned_int>_>::operator()
          (sparse_array_n<unsigned_int,_3,_std::allocator<unsigned_int>_> *this,uint d0,...)

{
  unordered_map<int,_unsigned_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
  *this_00;
  mapped_type mVar1;
  char in_AL;
  uint uVar2;
  iterator iVar3;
  mapped_type *pmVar4;
  undefined8 *puVar5;
  undefined8 in_RCX;
  undefined8 in_RDX;
  long lVar6;
  uint *puVar7;
  ulong uVar8;
  uint *puVar9;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list vl;
  uint local_fc;
  undefined8 local_f8;
  uint *local_f0;
  uint *local_e8;
  uint local_d8 [4];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  local_e8 = local_d8;
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  puVar7 = (uint *)&stack0x00000008;
  local_f8 = 0x3000000010;
  local_f0 = puVar7;
  local_c8 = in_RDX;
  local_c0 = in_RCX;
  local_b8 = in_R8;
  local_b0 = in_R9;
  if (d0 < this->_dims[0]) {
    local_f8._0_4_ = 0x10;
    lVar6 = 0;
    uVar2 = (uint)local_f8;
    while( true ) {
      if (uVar2 < 0x29) {
        uVar8 = (ulong)uVar2;
        uVar2 = uVar2 + 8;
        local_f8 = CONCAT44(local_f8._4_4_,uVar2);
        puVar9 = (uint *)((long)local_e8 + uVar8);
      }
      else {
        local_f0 = puVar7 + 2;
        puVar9 = puVar7;
        puVar7 = local_f0;
      }
      if (this->_dims[lVar6 + 1] <= *puVar9) break;
      d0 = d0 * this->_dims[lVar6 + 1] + *puVar9;
      lVar6 = lVar6 + 1;
      if (lVar6 == 2) {
        this_00 = &this->siteMap;
        local_fc = d0;
        iVar3 = std::
                _Hashtable<int,_std::pair<const_int,_unsigned_int>,_std::allocator<std::pair<const_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(&this_00->_M_h,(key_type *)&local_fc);
        if (iVar3.super__Node_iterator_base<std::pair<const_int,_unsigned_int>,_false>._M_cur ==
            (__node_type *)0x0) {
          mVar1 = this->defaultValue;
          local_fc = d0;
          pmVar4 = std::__detail::
                   _Map_base<int,_std::pair<const_int,_unsigned_int>,_std::allocator<std::pair<const_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<int,_std::pair<const_int,_unsigned_int>,_std::allocator<std::pair<const_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)this_00,(key_type *)&local_fc);
          *pmVar4 = mVar1;
        }
        local_fc = d0;
        pmVar4 = std::__detail::
                 _Map_base<int,_std::pair<const_int,_unsigned_int>,_std::allocator<std::pair<const_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<int,_std::pair<const_int,_unsigned_int>,_std::allocator<std::pair<const_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)this_00,(key_type *)&local_fc);
        return pmVar4;
      }
    }
  }
  puVar5 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar5 = "Index out of bounds!";
  __cxa_throw(puVar5,&char_const*::typeinfo,0);
}

Assistant:

inline T& operator()(unsigned int d0, ...) {
            unsigned int index = 0;
            va_list vl;
            va_start(vl, d0);
            index = linear_index(d0, vl);
            va_end(vl);

            auto iter = siteMap.find(index);
            if(iter == siteMap.end())
                siteMap[index] = defaultValue;

            return siteMap[index];
        }